

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# param-utils.cpp
# Opt level: O3

void wasm::ParamUtils::getUsedParams(wasm::Function*,wasm::Module*)::ParamLiveness::
     doVisitLocalSet(ParamLiveness*,wasm::Expression___(ParamLiveness *self,Expression **currp)

{
  Index *__args_1;
  LocalSet *this;
  BasicBlock *pBVar1;
  Expression *pEVar2;
  _Storage<wasm::Type,_true> _Var3;
  bool bVar4;
  Drop *this_00;
  Block *pBVar5;
  Expression *pEVar6;
  optional<wasm::Type> type;
  Builder local_50;
  initializer_list<wasm::Expression_*> local_48;
  Expression *local_38;
  Expression **local_30;
  
  if ((*currp)->_id == LocalSetId) {
    if (((self->super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>).
         super_CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>.
         currBasicBlock != (BasicBlock *)0x0) &&
       (bVar4 = Function::isParam((self->
                                  super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>
                                  ).
                                  super_CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>
                                  .
                                  super_PostWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>
                                  .super_Walker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.
                                  currFunction,*(Index *)(*currp + 1)), bVar4)) {
      this = (LocalSet *)*currp;
      local_30 = currp;
      if ((this->super_SpecificExpression<(wasm::Expression::Id)9>).super_Expression._id !=
          LocalSetId) goto LAB_00780c14;
      pBVar1 = (self->super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>).
               super_CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>.
               currBasicBlock;
      if (pBVar1 == (BasicBlock *)0x0) {
        bVar4 = LocalSet::isTee(this);
        local_38 = this->value;
        if (bVar4) {
          _Var3 = (_Storage<wasm::Type,_true>)
                  (this->super_SpecificExpression<(wasm::Expression::Id)9>).super_Expression.type.id
          ;
          if (_Var3 == (_Storage<wasm::Type,_true>)(local_38->type).id) {
            *currp = local_38;
          }
          else {
            local_50.wasm =
                 (self->super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>).
                 super_CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>.
                 super_PostWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.
                 super_Walker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.currModule;
            local_48._M_array = &local_38;
            local_48._M_len = 1;
            type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
            super__Optional_payload_base<wasm::Type>._8_8_ = 1;
            type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
            super__Optional_payload_base<wasm::Type>._M_payload = _Var3;
            pBVar5 = Builder::makeBlock<std::initializer_list<wasm::Expression_*>,_true>
                               (&local_50,&local_48,type);
            *currp = (Expression *)pBVar5;
          }
        }
        else {
          this_00 = (Drop *)MixedArena::allocSpace
                                      (&((self->
                                         super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>
                                         ).
                                         super_CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>
                                         .
                                         super_PostWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>
                                         .
                                         super_Walker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>
                                        .currModule)->allocator,0x18,8);
          (this_00->super_SpecificExpression<(wasm::Expression::Id)18>).super_Expression._id =
               DropId;
          (this_00->super_SpecificExpression<(wasm::Expression::Id)18>).super_Expression.type.id = 0
          ;
          this_00->value = local_38;
          Drop::finalize(this_00);
          *currp = (Expression *)this_00;
        }
      }
      else {
        local_48._M_array = (iterator)CONCAT44(local_48._M_array._4_4_,1);
        __args_1 = &this->index;
        std::vector<wasm::LivenessAction,std::allocator<wasm::LivenessAction>>::
        emplace_back<wasm::LivenessAction::What,unsigned_int&,wasm::Expression**&>
                  ((vector<wasm::LivenessAction,std::allocator<wasm::LivenessAction>> *)
                   &(pBVar1->contents).actions,(What *)&local_48,__args_1,&local_30);
        pEVar2 = this->value;
        pEVar6 = pEVar2;
        if ((pEVar2->_id == LocalGetId) ||
           ((pEVar2->_id == IfId &&
            ((pEVar6 = (Expression *)pEVar2[1].type.id, pEVar6->_id == LocalGetId ||
             ((pEVar6 = *(Expression **)(pEVar2 + 2), pEVar6 != (Expression *)0x0 &&
              (pEVar6->_id == LocalGetId)))))))) {
          LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>::addCopy
                    (&self->super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>
                     ,*__args_1,*(Index *)(pEVar6 + 1));
          LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>::addCopy
                    (&self->super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>
                     ,*__args_1,*(Index *)(pEVar6 + 1));
        }
      }
    }
    return;
  }
LAB_00780c14:
  __assert_fail("int(_id) == int(T::SpecificId)",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm.h"
                ,0x31b,"T *wasm::Expression::cast() [T = wasm::LocalSet]");
}

Assistant:

static void doVisitLocalSet(ParamLiveness* self, Expression** currp) {
      auto* set = (*currp)->cast<LocalSet>();
      if (self->currBasicBlock && self->getFunction()->isParam(set->index)) {
        Super::doVisitLocalSet(self, currp);
      }
    }